

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::ComputeHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,Index t_offset,Index *indices,
          size_t indexDomainSize)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  
  if (t != 0) {
    uVar3 = (ulong)t_offset;
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,indexDomainSize);
    iVar4 = t - 1;
    uVar5 = 0;
    do {
      auVar6._0_8_ = pow(auVar1._0_8_,(double)iVar4);
      auVar6._8_56_ = extraout_var;
      lVar2 = vcvttsd2usi_avx512f(auVar6._0_16_);
      uVar3 = uVar3 + (ulong)indices[uVar5] * lVar2;
      t_offset = (Index)uVar3;
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (t != uVar5);
  }
  return t_offset;
}

Assistant:

Index PlanningUnitMADPDiscrete::ComputeHistoryIndex(
        Index t,    //the stage
        Index t_offset, //for each stage t, there is an offset
        //const vector<Index>& indices, //the indices of the (J)(A/O)s
        const Index indices [], //the indices of the (J)(A/O)s
        size_t indexDomainSize //the indices range from 0...(indexDomainSize-1)
        ) const
{
    //This example assumes we are computing the index of an observation history:
    //
    //indices is a vector with the observation indices for stage 0...t-1
    //<o^0, o^1, ... , o^(t-1) >
    //from this we want to find the history observation index, which is given
    //by:
    //      o^0 * |O|^(t-1) + ... + o^(t-1) * |O|^0     + stage offset
    //
    //where |O| is the `base' of the number as specified by the tuple of 
    //indices
    //
    size_t HI=t_offset;
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)indexDomainSize, (double)(exponent));
        HI += indices[ts] * b;
    }
    return(HI);
}